

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O1

space_info *
boost::filesystem::detail::space(space_info *__return_storage_ptr__,path *p,error_code *ec)

{
  bool bVar1;
  int iVar2;
  statvfs vfs;
  statvfs64 sStack_88;
  
  iVar2 = statvfs64((p->m_pathname)._M_dataplus._M_p,&sStack_88);
  bVar1 = anon_unknown.dwarf_59c2::error((uint)(iVar2 != 0),p,ec,"boost::filesystem::space");
  if (bVar1) {
    __return_storage_ptr__->capacity = 0;
    __return_storage_ptr__->free = 0;
    __return_storage_ptr__->available = 0;
  }
  else {
    __return_storage_ptr__->capacity = sStack_88.f_blocks * sStack_88.f_frsize;
    __return_storage_ptr__->free = sStack_88.f_bfree * sStack_88.f_frsize;
    __return_storage_ptr__->available = sStack_88.f_frsize * sStack_88.f_bavail;
  }
  return __return_storage_ptr__;
}

Assistant:

BOOST_FILESYSTEM_DECL
  space_info space(const path& p, error_code* ec)
  {
#   ifdef BOOST_POSIX_API
    struct BOOST_STATVFS vfs;
    space_info info;
    if (!error(::BOOST_STATVFS(p.c_str(), &vfs)!= 0,
      p, ec, "boost::filesystem::space"))
    {
      info.capacity 
        = static_cast<boost::uintmax_t>(vfs.f_blocks)* BOOST_STATVFS_F_FRSIZE;
      info.free 
        = static_cast<boost::uintmax_t>(vfs.f_bfree)* BOOST_STATVFS_F_FRSIZE;
      info.available
        = static_cast<boost::uintmax_t>(vfs.f_bavail)* BOOST_STATVFS_F_FRSIZE;
    }

#   else
    ULARGE_INTEGER avail, total, free;
    space_info info;

    if (!error(::GetDiskFreeSpaceExW(p.c_str(), &avail, &total, &free)== 0,
       p, ec, "boost::filesystem::space"))
    {
      info.capacity
        = (static_cast<boost::uintmax_t>(total.HighPart)<< 32)
          + total.LowPart;
      info.free
        = (static_cast<boost::uintmax_t>(free.HighPart)<< 32)
          + free.LowPart;
      info.available
        = (static_cast<boost::uintmax_t>(avail.HighPart)<< 32)
          + avail.LowPart;
    }

#   endif

    else
    {
      info.capacity = info.free = info.available = 0;
    }